

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void pack_overflow(object *obj)

{
  loc grid;
  _Bool _Var1;
  uint uVar2;
  player_upkeep *ppVar3;
  long lVar4;
  object *obj_local;
  char o_name [80];
  
  obj_local = obj;
  _Var1 = pack_is_overfull();
  if (_Var1) {
    disturb(player);
    msg("Your pack overflows!");
    uVar2 = z_info->pack_size + 1;
    for (lVar4 = 1; lVar4 - (ulong)z_info->pack_size != 1; lVar4 = lVar4 + 1) {
      if (player->upkeep->inven[lVar4] == (object *)0x0) {
        uVar2 = (uint)lVar4;
        break;
      }
    }
    if (obj == (object *)0x0) {
      obj = player->upkeep->inven[(ulong)uVar2 - 1];
      obj_local = obj;
      if (obj == (object *)0x0) {
        __assert_fail("obj != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                      ,0x56f,"void pack_overflow(struct object *)");
      }
    }
    object_desc(o_name,0x50,obj,0x43,player);
    msg("You drop %s.",o_name);
    gear_excise_object(player,obj);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&obj_local,L'\0',grid,false,true);
    msg("You no longer have %s.",o_name);
    ppVar3 = player->upkeep;
    if (ppVar3->notice != 0) {
      notice_stuff(player);
      ppVar3 = player->upkeep;
    }
    if (ppVar3->update != 0) {
      update_stuff(player);
      ppVar3 = player->upkeep;
    }
    if (ppVar3->redraw != 0) {
      redraw_stuff(player);
    }
  }
  return;
}

Assistant:

void pack_overflow(struct object *obj)
{
	int i;
	char o_name[80];

	if (!pack_is_overfull()) return;

	/* Disturbing */
	disturb(player);

	/* Warning */
	msg("Your pack overflows!");

	/* Get the last proper item */
	for (i = 1; i <= z_info->pack_size; i++)
		if (!player->upkeep->inven[i])
			break;

	/* Drop the last inventory item unless requested otherwise */
	if (!obj) {
		obj = player->upkeep->inven[i - 1];
	}

	/* Rule out weirdness (like pack full, but inventory empty) */
	assert(obj != NULL);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s.", o_name);

	/* Excise the object and drop it (carefully) near the player */
	gear_excise_object(player, obj);
	drop_near(cave, &obj, 0, player->grid, false, true);

	/* Describe */
	msg("You no longer have %s.", o_name);

	/* Notice, update, redraw */
	if (player->upkeep->notice) notice_stuff(player);
	if (player->upkeep->update) update_stuff(player);
	if (player->upkeep->redraw) redraw_stuff(player);
}